

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O0

void __thiscall spvtools::utils::BitVector::ReportDensity(BitVector *this,ostream *out)

{
  bool bVar1;
  reference puVar2;
  ostream *poVar3;
  size_type sVar4;
  long lVar5;
  undefined1 auVar6 [16];
  ulong local_40;
  BitContainer e;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint32_t count;
  ostream *out_local;
  BitVector *this_local;
  
  __range2._4_4_ = 0;
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->bits_);
  e = (BitContainer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->bits_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&e);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end2);
    for (local_40 = *puVar2; local_40 != 0; local_40 = local_40 >> 1) {
      if ((local_40 & 1) != 0) {
        __range2._4_4_ = __range2._4_4_ + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  }
  poVar3 = std::operator<<(out,"count=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,__range2._4_4_);
  poVar3 = std::operator<<(poVar3,", total size (bytes)=");
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->bits_);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4 << 3);
  poVar3 = std::operator<<(poVar3,", bytes per element=");
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->bits_);
  lVar5 = sVar4 << 3;
  auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar6._0_8_ = lVar5;
  auVar6._12_4_ = 0x45300000;
  std::ostream::operator<<
            (poVar3,((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                    (double)__range2._4_4_);
  return;
}

Assistant:

void BitVector::ReportDensity(std::ostream& out) {
  uint32_t count = 0;

  for (BitContainer e : bits_) {
    while (e != 0) {
      if ((e & 1) != 0) {
        ++count;
      }
      e = e >> 1;
    }
  }

  out << "count=" << count
      << ", total size (bytes)=" << bits_.size() * sizeof(BitContainer)
      << ", bytes per element="
      << (double)(bits_.size() * sizeof(BitContainer)) / (double)(count);
}